

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::AddSubOp::AddSubOp(AddSubOp *this)

{
  allocator local_31;
  string local_30 [32];
  AddSubOp *local_10;
  AddSubOp *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"AddSubOp",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

MyCompiler::AddSubOp::AddSubOp()
        : AbstractAstNode("AddSubOp")
{}